

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

CopyConst<char,_ElementType<2UL>_>_conflict9 * __thiscall
phmap::priv::internal_layout::
LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>*,unsigned_char,phmap::test_internal::MovableOnlyInstance,phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
::Pointer<2ul,char>(LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>*,unsigned_char,phmap::test_internal::MovableOnlyInstance,phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
                    *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return (CopyConst<char,_ElementType<2UL>_>_conflict9 *)
           (p + (*(long *)(this + 8) + *(long *)this * 8 + 7U & 0xfffffffffffffff8));
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, std::allocator<phmap::test_internal::MovableOnlyInstance>, 992, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }